

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  double *pdVar2;
  ulong uVar3;
  ulong col;
  
  if (transid != 0) {
    col = 0;
    uVar3 = (ulong)(uint)num;
    if (num < 1) {
      uVar3 = col;
    }
    for (; uVar3 != col; col = col + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(in,0,col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(in,0,col);
      *pdVar2 = -dVar1;
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<REAL> &in) {
		
		if(transid == 0) return;
		int i;
		for(i=0;i<num;i++) in(0,i) = -in(0,i);
	}